

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_table_function.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformRangeFunction(Transformer *this,PGRangeFunction *root)

{
  int iVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  PGAlias *root_00;
  undefined8 uVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  Transformer *this_00;
  pointer pTVar5;
  type ref;
  NotImplementedException *pNVar6;
  ParserException *this_01;
  long in_RDX;
  pointer *__ptr;
  optional_ptr<duckdb_libpgquery::PGFuncCall,_true> func_call;
  optional_ptr<duckdb_libpgquery::PGNode,_true> call_tree;
  optional_ptr<duckdb_libpgquery::PGList,_true> function_sublist;
  undefined1 local_68 [32];
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> local_48;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_38;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_30;
  
  if (*(char *)(in_RDX + 5) == '\x01') {
    pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"WITH ORDINALITY not implemented","");
    NotImplementedException::NotImplementedException(pNVar6,(string *)local_68);
    __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(char *)(in_RDX + 6) == '\x01') {
    pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"ROWS FROM() not implemented","");
    NotImplementedException::NotImplementedException(pNVar6,(string *)local_68);
    __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(int *)(*(long *)(in_RDX + 8) + 4) != 1) {
    pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Need exactly one function","");
    NotImplementedException::NotImplementedException(pNVar6,(string *)local_68);
    __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_30.ptr = (PGList *)**(long **)(*(long *)(in_RDX + 8) + 8);
  optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&stack0xffffffffffffffd0);
  local_38.ptr = (PGNode *)((local_30.ptr)->head->data).ptr_value;
  optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&stack0xffffffffffffffd0);
  if (((local_30.ptr)->head->next->data).ptr_value == (void *)0x0) {
    this_00 = (Transformer *)operator_new(0x78);
    TableFunctionRef::TableFunctionRef((TableFunctionRef *)this_00);
    local_48._M_head_impl = (TableFunctionRef *)this_00;
    optional_ptr<duckdb_libpgquery::PGNode,_true>::CheckValid(&stack0xffffffffffffffc8);
    iVar1._0_1_ = *(LogicalTypeId *)&(local_38.ptr)->type;
    iVar1._1_1_ = *(PhysicalType *)((long)&(local_38.ptr)->type + 1);
    iVar1._2_2_ = *(undefined2 *)((long)&(local_38.ptr)->type + 2);
    if (iVar1 == 0x83) {
      local_40._M_head_impl = (ParsedExpression *)local_38.ptr;
      optional_ptr<duckdb_libpgquery::PGSQLValueFunction,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGSQLValueFunction,_true> *)
                 &stack0xffffffffffffffc0);
      TransformSQLValueFunction((Transformer *)local_68,(PGSQLValueFunction *)root);
      pTVar5 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                             *)&local_48);
      uVar3 = local_68._0_8_;
      local_68._0_8_ = (Transformer *)0x0;
      _Var2._M_head_impl =
           (pTVar5->function).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pTVar5->function).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)uVar3;
      if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        if ((Transformer *)local_68._0_8_ != (Transformer *)0x0) {
          (**(code **)(*(long *)local_68._0_8_ + 8))();
        }
      }
    }
    else {
      if (iVar1 != 0x165) {
        this_01 = (ParserException *)__cxa_allocate_exception(0x10);
        local_68._0_8_ = local_68 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"Not a function call or value function","");
        ParserException::ParserException(this_01,(string *)local_68);
        __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_68._0_8_ = local_38.ptr;
      optional_ptr<duckdb_libpgquery::PGFuncCall,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGFuncCall,_true> *)local_68);
      TransformFuncCall((Transformer *)&stack0xffffffffffffffc0,(PGFuncCall *)root);
      pTVar5 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                             *)&local_48);
      _Var4._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = (ParsedExpression *)0x0;
      _Var2._M_head_impl =
           (pTVar5->function).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pTVar5->function).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var4._M_head_impl;
      if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        if ((Transformer *)local_40._M_head_impl != (Transformer *)0x0) {
          (**(code **)(*(long *)&((Value *)&((_Hash_node_base *)local_40._M_head_impl)->_M_nxt)->
                                 type_ + 8))();
        }
      }
      ref = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
            ::operator*((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                         *)&local_48);
      optional_ptr<duckdb_libpgquery::PGFuncCall,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGFuncCall,_true> *)local_68);
      SetQueryLocation(&ref->super_TableRef,*(int *)(local_68._0_8_ + 0x40));
    }
    root_00 = *(PGAlias **)(in_RDX + 0x10);
    pTVar5 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
             ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                           *)&local_48);
    TransformAlias((string *)local_68,(Transformer *)root,root_00,
                   &(pTVar5->super_TableRef).column_name_alias);
    pTVar5 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
             ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                           *)&local_48);
    ::std::__cxx11::string::operator=((string *)&(pTVar5->super_TableRef).alias,(string *)local_68);
    if ((Transformer *)local_68._0_8_ != (Transformer *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_);
    }
    if (*(long *)(in_RDX + 0x20) != 0) {
      TransformSampleOptions
                ((Transformer *)local_68,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      pTVar5 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                             *)&local_48);
      uVar3 = local_68._0_8_;
      local_68._0_8_ = (Transformer *)0x0;
      ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::
      reset((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
            &(pTVar5->super_TableRef).sample,(pointer)uVar3);
      uVar3 = local_68._0_8_;
      if ((Transformer *)local_68._0_8_ != (Transformer *)0x0) {
        Value::~Value((Value *)local_68._0_8_);
        operator_delete((void *)uVar3);
      }
    }
    (this->parent).ptr = (Transformer *)local_48._M_head_impl;
    return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
           (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
  }
  pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_68._0_8_ = local_68 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Explicit column definition not supported yet","");
  NotImplementedException::NotImplementedException(pNVar6,(string *)local_68);
  __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<TableRef> Transformer::TransformRangeFunction(duckdb_libpgquery::PGRangeFunction &root) {
	if (root.ordinality) {
		throw NotImplementedException("WITH ORDINALITY not implemented");
	}
	if (root.is_rowsfrom) {
		throw NotImplementedException("ROWS FROM() not implemented");
	}
	if (root.functions->length != 1) {
		throw NotImplementedException("Need exactly one function");
	}
	auto function_sublist = PGPointerCast<duckdb_libpgquery::PGList>(root.functions->head->data.ptr_value);
	D_ASSERT(function_sublist->length == 2);
	auto call_tree = PGPointerCast<duckdb_libpgquery::PGNode>(function_sublist->head->data.ptr_value);
	auto coldef = function_sublist->head->next->data.ptr_value;

	if (coldef) {
		throw NotImplementedException("Explicit column definition not supported yet");
	}
	// transform the function call
	auto result = make_uniq<TableFunctionRef>();
	switch (call_tree->type) {
	case duckdb_libpgquery::T_PGFuncCall: {
		auto func_call = PGPointerCast<duckdb_libpgquery::PGFuncCall>(call_tree.get());
		result->function = TransformFuncCall(*func_call);
		SetQueryLocation(*result, func_call->location);
		break;
	}
	case duckdb_libpgquery::T_PGSQLValueFunction:
		result->function =
		    TransformSQLValueFunction(*PGPointerCast<duckdb_libpgquery::PGSQLValueFunction>(call_tree.get()));
		break;
	default:
		throw ParserException("Not a function call or value function");
	}
	result->alias = TransformAlias(root.alias, result->column_name_alias);
	if (root.sample) {
		result->sample = TransformSampleOptions(root.sample);
	}
	return std::move(result);
}